

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O0

void __thiscall
glcts::GPUShader5FmaAccuracyTest::logArray
          (GPUShader5FmaAccuracyTest *this,char *description,GLfloat *data,GLuint length)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  uint local_33c;
  undefined1 local_338 [4];
  GLuint i;
  MessageBuilder message;
  MessageBuilder local_1a8;
  GLuint local_24;
  GLfloat *pGStack_20;
  GLuint length_local;
  GLfloat *data_local;
  char *description_local;
  GPUShader5FmaAccuracyTest *this_local;
  
  local_24 = length;
  pGStack_20 = data;
  data_local = (GLfloat *)description;
  description_local = (char *)this;
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a8,(char **)&data_local);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  pTVar1 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_338,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,(char (*) [3])0x2c81fb2);
  for (local_33c = 0; local_33c < local_24; local_33c = local_33c + 1) {
    pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,pGStack_20 + local_33c);
    tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])0x2c81fb1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_338);
  return;
}

Assistant:

void GPUShader5FmaAccuracyTest::logArray(const char* description, glw::GLfloat* data, glw::GLuint length)
{
	m_testCtx.getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

	tcu::MessageBuilder message = m_testCtx.getLog() << tcu::TestLog::Message;

	message << "| ";

	for (glw::GLuint i = 0; i < length; ++i)
	{
		message << data[i] << " | ";
	}

	message << tcu::TestLog::EndMessage;
}